

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall Catch::Generators::GeneratorTracker::close(GeneratorTracker *this,int __fd)

{
  uint uVar1;
  pointer pGVar2;
  anon_class_8_1_8991fb9c local_20;
  undefined1 local_11;
  GeneratorTracker *pGStack_10;
  bool should_wait_for_child;
  GeneratorTracker *this_local;
  GeneratorTracker *pGVar3;
  
  pGStack_10 = this;
  TestCaseTracking::TrackerBase::close(&this->super_TrackerBase,__fd);
  local_20.this = this;
  local_11 = close::anon_class_8_1_8991fb9c::operator()(&local_20);
  if (!(bool)local_11) {
    pGVar3 = this;
    if ((this->super_TrackerBase).m_runState != CompletedSuccessfully) goto LAB_001648b3;
    pGVar2 = clara::std::
             unique_ptr<Catch::Generators::GeneratorUntypedBase,_std::default_delete<Catch::Generators::GeneratorUntypedBase>_>
             ::operator->(&this->m_generator);
    uVar1 = (*pGVar2->_vptr_GeneratorUntypedBase[2])();
    pGVar3 = (GeneratorTracker *)(ulong)uVar1;
    if ((uVar1 & 1) == 0) goto LAB_001648b3;
  }
  clara::std::
  vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
  ::clear(&(this->super_TrackerBase).m_children);
  (this->super_TrackerBase).m_runState = Executing;
  pGVar3 = this;
LAB_001648b3:
  return (int)pGVar3;
}

Assistant:

void close() override {
                TrackerBase::close();
                // If a generator has a child (it is followed by a section)
                // and none of its children have started, then we must wait
                // until later to start consuming its values.
                // This catches cases where `GENERATE` is placed between two
                // `SECTION`s.
                // **The check for m_children.empty cannot be removed**.
                // doing so would break `GENERATE` _not_ followed by `SECTION`s.
                const bool should_wait_for_child = [&]() {
                    // No children -> nobody to wait for
                    if ( m_children.empty() ) {
                        return false;
                    }
                    // If at least one child started executing, don't wait
                    if ( std::find_if(
                             m_children.begin(),
                             m_children.end(),
                             []( TestCaseTracking::ITrackerPtr tracker ) {
                                 return tracker->hasStarted();
                             } ) != m_children.end() ) {
                        return false;
                    }

                    // No children have started. We need to check if they _can_
                    // start, and thus we should wait for them, or they cannot
                    // start (due to filters), and we shouldn't wait for them
                    auto* parent = m_parent;
                    // This is safe: there is always at least one section
                    // tracker in a test case tracking tree
                    while ( !parent->isSectionTracker() ) {
                        parent = &( parent->parent() );
                    }
                    assert( parent &&
                            "Missing root (test case) level section" );

                    auto const& parentSection =
                        static_cast<SectionTracker&>( *parent );
                    auto const& filters = parentSection.getFilters();
                    // No filters -> no restrictions on running sections
                    if ( filters.empty() ) {
                        return true;
                    }

                    for ( auto const& child : m_children ) {
                        if ( child->isSectionTracker() &&
                             std::find( filters.begin(),
                                        filters.end(),
                                        static_cast<SectionTracker&>( *child )
                                            .trimmedName() ) !=
                                 filters.end() ) {
                            return true;
                        }
                    }
                    return false;
                }();

                // This check is a bit tricky, because m_generator->next()
                // has a side-effect, where it consumes generator's current
                // value, but we do not want to invoke the side-effect if
                // this generator is still waiting for any child to start.
                if ( should_wait_for_child ||
                     ( m_runState == CompletedSuccessfully &&
                       m_generator->next() ) ) {
                    m_children.clear();
                    m_runState = Executing;
                }
            }